

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.cpp
# Opt level: O1

void __thiscall
isotree::IsolationForest::serialize_template<std::ostream>
          (IsolationForest *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  Imputer *indexer;
  Imputer *imputer;
  Imputer *model_ext;
  Imputer *model;
  Imputer *pIVar1;
  
  check_is_fitted(this);
  pIVar1 = (Imputer *)0x0;
  model = (Imputer *)&this->model;
  if ((this->model).trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->model).trees.
      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    model = pIVar1;
  }
  model_ext = (Imputer *)&this->model_ext;
  if ((this->model_ext).hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->model_ext).hplanes.
      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    model_ext = pIVar1;
  }
  imputer = &this->imputer;
  if ((this->imputer).imputer_tree.
      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->imputer).imputer_tree.
      super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    imputer = pIVar1;
  }
  indexer = (Imputer *)&this->indexer;
  if ((this->indexer).indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->indexer).indices.super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    indexer = pIVar1;
  }
  serialize_combined((IsoForest *)model,(ExtIsoForest *)model_ext,imputer,(TreesIndexer *)indexer,
                     (char *)0x0,0,out);
  return;
}

Assistant:

void IsolationForest::serialize_template(otype &out) const
{
    this->check_is_fitted();

    serialize_combined(
        (!this->model.trees.empty())? &this->model : nullptr,
        (!this->model_ext.hplanes.empty())? &this->model_ext : nullptr,
        (!this->imputer.imputer_tree.empty())? &this->imputer : nullptr,
        (!this->indexer.indices.empty())? &this->indexer : nullptr,
        (char*)nullptr,
        (size_t)0,
        out
    );
}